

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

bool __thiscall wabt::anon_unknown_25::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  undefined1 uVar1;
  
  if (type.enum_ < F64) {
    if ((uint)(type.enum_ + ~(ExnRef|I16U)) < 2) {
      return (this->options_->features).reference_types_enabled_;
    }
    if (type.enum_ == ExnRef) {
      return (this->options_->features).exceptions_enabled_;
    }
    if (type.enum_ != V128) {
      return false;
    }
    uVar1 = (this->options_->features).simd_enabled_;
  }
  else {
    uVar1 = 1;
    if (3 < (uint)(type.enum_ + I8U)) {
      return false;
    }
  }
  return (bool)uVar1;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    case Type::FuncRef:
    case Type::ExternRef:
      return options_.features.reference_types_enabled();

    case Type::ExnRef:
      return options_.features.exceptions_enabled();

    default:
      return false;
  }
}